

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_definedUnitsImport_Test::~Units_definedUnitsImport_Test(Units_definedUnitsImport_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, definedUnitsImport)
{
    libcellml::UnitsPtr u = libcellml::Units::create("only_standard_units");

    libcellml::ImportSourcePtr importSource = libcellml::ImportSource::create();
    importSource->setUrl("I_am_a_url");

    u->setImportSource(importSource);
    u->setImportReference("ref");

    EXPECT_FALSE(u->isDefined());
}